

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O3

void __thiscall
irr::video::COpenGLDriver::disableFeature
          (COpenGLDriver *this,E_VIDEO_DRIVER_FEATURE feature,bool flag)

{
  bool bVar1;
  int iVar2;
  
  CNullDriver::disableFeature(&this->super_CNullDriver,feature,flag);
  if (feature == EVDF_TEXTURE_CUBEMAP_SEAMLESS) {
    iVar2 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[2])(this,0x25);
    if ((char)iVar2 != '\0') {
      glEnable(0x884f);
      return;
    }
    bVar1 = COpenGLExtensionHandler::queryFeature
                      ((COpenGLExtensionHandler *)&(this->super_CNullDriver).field_0x498,
                       EVDF_TEXTURE_CUBEMAP_SEAMLESS);
    if (bVar1) {
      glDisable(0x884f);
      return;
    }
  }
  return;
}

Assistant:

void COpenGLDriver::disableFeature(E_VIDEO_DRIVER_FEATURE feature, bool flag)
{
	CNullDriver::disableFeature(feature, flag);

	if (feature == EVDF_TEXTURE_CUBEMAP_SEAMLESS) {
		if (queryFeature(feature))
			glEnable(GL_TEXTURE_CUBE_MAP_SEAMLESS);
		else if (COpenGLExtensionHandler::queryFeature(feature))
			glDisable(GL_TEXTURE_CUBE_MAP_SEAMLESS);
	}
}